

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

void __thiscall QTextStream::setGenerateByteOrderMark(QTextStream *this,bool generate)

{
  long lVar1;
  QTextStreamPrivate *this_00;
  undefined1 in_SIL;
  long in_FS_OFFSET;
  QTextStreamPrivate *d;
  undefined4 in_stack_ffffffffffffff98;
  Flag flags;
  undefined3 in_stack_ffffffffffffffac;
  QFlagsStorage<QStringConverterBase::Flag> flags_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  flags_00.i = CONCAT13(in_SIL,in_stack_ffffffffffffffac) & 0x1ffffff;
  this_00 = d_func((QTextStream *)0x4ada1e);
  if (((this_00->hasWrittenData & 1U) == 0) &&
     ((this_00->generateBOM & 1U) != (SUB41(flags_00.i,3) & 1))) {
    this_00->generateBOM = (bool)(SUB41(flags_00.i,3) & 1);
    flags = this_00->encoding;
    QFlags<QStringConverterBase::Flag>::QFlags((QFlags<QStringConverterBase::Flag> *)this_00,flags);
    QStringEncoder::QStringEncoder((QStringEncoder *)this_00,flags,(Flags)flags_00.i);
    QStringEncoder::operator=
              ((QStringEncoder *)this_00,(QStringEncoder *)CONCAT44(flags,in_stack_ffffffffffffff98)
              );
    QStringEncoder::~QStringEncoder((QStringEncoder *)0x4adab9);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextStream::setGenerateByteOrderMark(bool generate)
{
    Q_D(QTextStream);
    if (d->hasWrittenData || d->generateBOM == generate)
        return;

    d->generateBOM = generate;
    d->fromUtf16 = QStringEncoder(d->encoding, generate ? QStringConverter::Flag::WriteBom : QStringConverter::Flag::Default);
}